

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::WebSocket> __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::acceptWebSocket
          (WebSocketResponseImpl *this,HttpHeaders *headers)

{
  Own<kj::WebSocket> *pOVar1;
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *pPVar2;
  int in_ECX;
  __fn *in_RDX;
  WebSocket *extraout_RDX;
  void *in_R8;
  Own<kj::WebSocket> OVar3;
  Own<kj::WebSocket> local_148;
  undefined1 local_138 [56];
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> local_100;
  Promise<void> local_f0;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket> local_e0;
  undefined1 local_d0 [8];
  Own<kj::WebSocket> wrapper;
  WebSocketPipe pipe;
  HttpHeaders local_90;
  undefined1 local_30 [8];
  Own<kj::HttpHeaders> headersCopy;
  HttpHeaders *headers_local;
  WebSocketResponseImpl *this_local;
  
  HttpHeaders::clone(&local_90,in_RDX,in_RDX,in_ECX,in_R8);
  heap<kj::HttpHeaders>((kj *)local_30,&local_90);
  HttpHeaders::~HttpHeaders(&local_90);
  newWebSocketPipe();
  pOVar1 = mv<kj::Own<kj::WebSocket>>((Own<kj::WebSocket> *)&wrapper.ptr);
  addRef<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>
            ((kj *)&local_100,(WebSocketResponseImpl *)headers);
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>>
            (&local_f0,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> *)
             &(headers->unindexedHeaders).builder.pos);
  heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket,kj::Own<kj::WebSocket>,kj::Promise<void>>
            ((kj *)&local_e0,pOVar1,&local_f0);
  Own<kj::WebSocket>::Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket,void>
            ((Own<kj::WebSocket> *)local_d0,&local_e0);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>::~Own(&local_e0);
  Promise<void>::~Promise(&local_f0);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>::~Own(&local_100);
  pPVar2 = Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_>::operator->
                     ((Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_> *)
                      &(headers->indexedHeaders).disposer);
  local_138._0_4_ = 0x65;
  StringPtr::StringPtr((StringPtr *)(local_138 + 8),"Switching Protocols");
  local_138._24_8_ = Own<kj::HttpHeaders>::get((Own<kj::HttpHeaders> *)local_30);
  mv<kj::Own<kj::HttpHeaders>>((Own<kj::HttpHeaders> *)local_30);
  Own<kj::WebSocket>::attach<kj::Own<kj::HttpHeaders>>(&local_148,(Own<kj::HttpHeaders> *)local_d0);
  OneOf<kj::Own<kj::AsyncInputStream>,kj::Own<kj::WebSocket>>::OneOf<kj::Own<kj::WebSocket>>
            ((OneOf<kj::Own<kj::AsyncInputStream>,kj::Own<kj::WebSocket>> *)(local_138 + 0x20),
             &local_148);
  (**pPVar2->_vptr_PromiseFulfiller)(pPVar2,local_138);
  HttpClient::WebSocketResponse::~WebSocketResponse((WebSocketResponse *)local_138);
  Own<kj::WebSocket>::~Own(&local_148);
  pOVar1 = mv<kj::Own<kj::WebSocket>>((Own<kj::WebSocket> *)&pipe.ends[0].ptr);
  Own<kj::WebSocket>::Own((Own<kj::WebSocket> *)this,pOVar1);
  Own<kj::WebSocket>::~Own((Own<kj::WebSocket> *)local_d0);
  WebSocketPipe::~WebSocketPipe((WebSocketPipe *)&wrapper.ptr);
  Own<kj::HttpHeaders>::~Own((Own<kj::HttpHeaders> *)local_30);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<WebSocket> acceptWebSocket(const HttpHeaders& headers) override {
      // The caller of HttpClient is allowed to assume that the headers remain valid until the body
      // stream is dropped, but the HttpService implementation is allowed to send headers that are
      // only valid until acceptWebSocket() returns, so we have to copy.
      auto headersCopy = kj::heap(headers.clone());

      auto pipe = newWebSocketPipe();

      // Wrap the client-side WebSocket in a wrapper that delays clean close of the WebSocket until
      // the service's request promise has finished.
      kj::Own<WebSocket> wrapper =
          kj::heap<DelayedCloseWebSocket>(kj::mv(pipe.ends[0]), task.attach(kj::addRef(*this)));
      fulfiller->fulfill({
        101, "Switching Protocols", headersCopy.get(),
        wrapper.attach(kj::mv(headersCopy))
      });
      return kj::mv(pipe.ends[1]);
    }